

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

ON_NurbsCurve * ReadV1_RHINOIO_NURBS_CURVE_OBJECT_DATA(ON_BinaryArchive *file)

{
  ON_NurbsCurve *this;
  bool bVar1;
  ON_BinaryArchive *this_00;
  double *p;
  int local_6c;
  int cvdim;
  int local_4c;
  int local_48;
  int i;
  int flag;
  int cv_count;
  int order;
  int is_rat;
  int dim;
  int version;
  ON__INT64 big_value;
  ON__UINT32 tcode;
  bool rc;
  ON_NurbsCurve *curve;
  ON_BinaryArchive *file_local;
  
  _tcode = (ON_BinaryArchive *)0x0;
  big_value._7_1_ = 0;
  big_value._0_4_ = 0;
  _dim = 0;
  curve = (ON_NurbsCurve *)file;
  bVar1 = ON_BinaryArchive::BeginRead3dmBigChunk(file,(uint *)&big_value,(ON__INT64 *)&dim);
  if (bVar1) {
    if (((((int)big_value == 0x2fffe) &&
         (bVar1 = ON_BinaryArchive::ReadInt((ON_BinaryArchive *)curve,&is_rat), bVar1)) &&
        ((is_rat = is_rat & 0xfffffeff, is_rat == 100 || (is_rat == 0x65)))) &&
       (((((ON_BinaryArchive::ReadInt((ON_BinaryArchive *)curve,&order), 0 < order &&
           (ON_BinaryArchive::ReadInt((ON_BinaryArchive *)curve,&cv_count), -1 < cv_count)) &&
          (cv_count < 2)) &&
         ((ON_BinaryArchive::ReadInt((ON_BinaryArchive *)curve,&flag), 1 < flag &&
          (ON_BinaryArchive::ReadInt((ON_BinaryArchive *)curve,&i), flag <= i)))) &&
        (ON_BinaryArchive::ReadInt((ON_BinaryArchive *)curve,&local_48), local_48 == 0)))) {
      this_00 = (ON_BinaryArchive *)operator_new(0x40);
      ON_NurbsCurve::ON_NurbsCurve((ON_NurbsCurve *)this_00,order,cv_count != 0,flag,i);
      _tcode = this_00;
      bVar1 = ON_BinaryArchive::ReadDouble
                        ((ON_BinaryArchive *)curve,(long)(flag + i + -2),
                         *(double **)&this_00->m_3dm_previous_table);
      if (bVar1) {
        if (cv_count == 0) {
          local_6c = order;
        }
        else {
          local_6c = order + 1;
        }
        for (local_4c = 0; this = curve, local_4c < i; local_4c = local_4c + 1) {
          p = ON_NurbsCurve::CV((ON_NurbsCurve *)_tcode,local_4c);
          bVar1 = ON_BinaryArchive::ReadDouble((ON_BinaryArchive *)this,(long)local_6c,p);
          if (!bVar1) break;
        }
        if (i <= local_4c) {
          big_value._7_1_ = 1;
        }
      }
    }
    bVar1 = ON_BinaryArchive::EndRead3dmChunk((ON_BinaryArchive *)curve);
    if (!bVar1) {
      big_value._7_1_ = 0;
    }
    if (((big_value._7_1_ & 1) == 0) && (_tcode != (ON_BinaryArchive *)0x0)) {
      if (_tcode != (ON_BinaryArchive *)0x0) {
        (*(((ON_Curve *)&_tcode->_vptr_ON_BinaryArchive)->super_ON_Geometry).super_ON_Object.
          _vptr_ON_Object[4])();
      }
      _tcode = (ON_BinaryArchive *)0x0;
    }
    file_local = _tcode;
  }
  else {
    file_local = (ON_BinaryArchive *)0x0;
  }
  return (ON_NurbsCurve *)file_local;
}

Assistant:

static
ON_NurbsCurve* ReadV1_RHINOIO_NURBS_CURVE_OBJECT_DATA( ON_BinaryArchive& file )
{
  // read TCODE_RHINOIO_OBJECT_DATA chunk that is contained in a
  // TCODE_RHINOIO_OBJECT_NURBS_CURVE chunk.  The TCODE_RHINOIO_OBJECT_DATA
  // chunk contains the definition of NURBS curves written by the 
  // old RhinoIO toolkit.
  ON_NurbsCurve* curve = 0;
  bool rc = false;
  ON__UINT32 tcode = 0;
  ON__INT64 big_value = 0;
  int version, dim, is_rat, order, cv_count, flag, i;
  if ( !file.BeginRead3dmBigChunk( &tcode, &big_value ) )
    return nullptr;
  if ( tcode == TCODE_RHINOIO_OBJECT_DATA ) for (;;) {
    if ( !file.ReadInt(&version) )
      break;
    // int bReverse = version & 0x100;
    version &= 0xFFFFFEFF;
    if ( version != 100 && version != 101 )
      break;
    file.ReadInt(&dim);
    if ( dim < 1 )
      break;
    file.ReadInt(&is_rat);
    if ( is_rat < 0 || is_rat > 1 )
      break;
    file.ReadInt(&order);
    if ( order < 2 )
      break;
    file.ReadInt(&cv_count);
    if ( cv_count < order )
      break;
    file.ReadInt(&flag);
    if ( flag != 0 )
      break;

    curve = new ON_NurbsCurve(dim,is_rat,order,cv_count);
    if ( !file.ReadDouble( order+cv_count-2, curve->m_knot ) )
      break;
    int cvdim = is_rat ? dim+1 : dim;
    for ( i = 0; i < cv_count; i++ ) {
      if ( !file.ReadDouble( cvdim, curve->CV(i) ) )
        break;
    }
    if ( i < cv_count )
      break;
    rc = true;
    break;
  }
  if ( !file.EndRead3dmChunk() ) // end of TCODE_RHINOIO_OBJECT_DATA chunk
    rc = false;
  if ( !rc && curve ) {
    delete curve;
    curve = 0;
  }

  return curve;
}